

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_getfield(lua_State *L,int idx,char *k)

{
  TValue *pTVar1;
  cTValue *str;
  lua_State *L_00;
  size_t lenx;
  cTValue local_e8;
  TValue key;
  cTValue *t;
  cTValue *v;
  char *k_local;
  lua_State *plStack_c0;
  int idx_local;
  lua_State *L_local;
  cTValue *local_b0;
  lua_State *local_a8;
  GCstr *local_a0;
  cTValue *local_98;
  lua_State *local_90;
  TValue local_88;
  TValue *o;
  lua_State *local_78;
  char *local_70;
  cTValue *local_68;
  lua_State *local_60;
  undefined4 local_54;
  GCstr *local_50;
  cTValue *local_48;
  lua_State *local_40;
  undefined4 local_34;
  GCstr *local_30;
  cTValue *local_28;
  char *local_20;
  cTValue *local_18;
  lua_State *local_10;
  
  v = (cTValue *)k;
  k_local._4_4_ = idx;
  plStack_c0 = L;
  o._4_4_ = idx;
  local_78 = L;
  key = (TValue)index2adr(L,idx);
  L_00 = plStack_c0;
  str = v;
  local_88 = key;
  lenx = strlen((char *)&v->it64);
  local_a0 = lj_str_new(L_00,(char *)&str->it64,lenx);
  local_90 = L_00;
  local_98 = &local_e8;
  local_40 = L_00;
  local_54 = 0xfffffffb;
  local_34 = 0xfffffffb;
  local_e8.u64 = (ulong)local_a0 | 0xfffd800000000000;
  local_10 = L_00;
  local_20 = "store to dead GC object";
  local_50 = local_a0;
  local_48 = local_98;
  local_30 = local_a0;
  local_28 = local_98;
  local_18 = local_98;
  t = lj_meta_tget(plStack_c0,(cTValue *)key,&local_e8);
  if (t == (cTValue *)0x0) {
    plStack_c0->top = plStack_c0->top + 2;
    lj_vm_call(plStack_c0,plStack_c0->top + -2,2);
    plStack_c0->top = plStack_c0->top + -3;
    t = plStack_c0->top + 2;
  }
  local_b0 = plStack_c0->top;
  local_a8 = plStack_c0;
  L_local = (lua_State *)&t->gcr;
  *local_b0 = *t;
  local_60 = plStack_c0;
  local_70 = "copy of dead GC object";
  pTVar1 = plStack_c0->top;
  plStack_c0->top = pTVar1 + 1;
  if ((TValue *)(plStack_c0->maxstack).ptr64 <= pTVar1 + 1) {
    local_68 = local_b0;
    lj_state_growstack1(plStack_c0);
  }
  return;
}

Assistant:

LUA_API void lua_getfield(lua_State *L, int idx, const char *k)
{
  cTValue *v, *t = index2adr_check(L, idx);
  TValue key;
  setstrV(L, &key, lj_str_newz(L, k));
  v = lj_meta_tget(L, t, &key);
  if (v == NULL) {
    L->top += 2;
    lj_vm_call(L, L->top-2, 1+1);
    L->top -= 2+LJ_FR2;
    v = L->top+1+LJ_FR2;
  }
  copyTV(L, L->top, v);
  incr_top(L);
}